

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cardinality_estimator.cpp
# Opt level: O2

DenomInfo * __thiscall
duckdb::CardinalityEstimator::GetDenominator
          (DenomInfo *__return_storage_ptr__,CardinalityEstimator *this,JoinRelationSet *set)

{
  JoinRelationSetManager *this_00;
  double dVar1;
  pointer pSVar2;
  Subgraph2Denominator left;
  Subgraph2Denominator left_00;
  Subgraph2Denominator right;
  Subgraph2Denominator right_00;
  Subgraph2Denominator right_01;
  Subgraph2Denominator right_02;
  Subgraph2Denominator left_01;
  Subgraph2Denominator left_02;
  Subgraph2Denominator left_03;
  Subgraph2Denominator right_03;
  Subgraph2Denominator left_04;
  Subgraph2Denominator right_04;
  size_type sVar3;
  __type _Var4;
  bool bVar5;
  reference pvVar6;
  JoinRelationSet *pJVar7;
  long lVar8;
  reference pvVar9;
  FilterInfo *pFVar10;
  JoinRelationSet *pJVar11;
  reference this_01;
  pointer this_02;
  long lVar12;
  Subgraph2Denominator *pSVar13;
  const_iterator __first;
  CardinalityEstimator *pCVar14;
  Subgraph2Denominator *pSVar15;
  CardinalityEstimator *edge;
  vector<duckdb::Subgraph2Denominator,_true> subgraphs;
  Subgraph2Denominator right_subgraph;
  JoinRelationSet *local_100;
  undefined4 local_f8;
  undefined4 uStack_f4;
  vector<unsigned_long,_true> subgraph_connections;
  double local_c8;
  vector<duckdb::FilterInfoWithTotalDomains,_true> edges;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  unused_edge_tdoms;
  Subgraph2Denominator *pSVar16;
  
  subgraphs.
  super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>.
  super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  subgraphs.
  super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>.
  super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  subgraphs.
  super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>.
  super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  unused_edge_tdoms._M_h._M_buckets = &unused_edge_tdoms._M_h._M_single_bucket;
  unused_edge_tdoms._M_h._M_bucket_count = 1;
  unused_edge_tdoms._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  unused_edge_tdoms._M_h._M_element_count = 0;
  unused_edge_tdoms._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  unused_edge_tdoms._M_h._M_rehash_policy._M_next_resize = 0;
  unused_edge_tdoms._M_h._M_single_bucket = (__node_base_ptr)0x0;
  GetEdges(&edges,&this->relations_to_tdoms,set);
  this_00 = &this->set_manager;
  edge = (CardinalityEstimator *)
         edges.
         super_vector<duckdb::FilterInfoWithTotalDomains,_std::allocator<duckdb::FilterInfoWithTotalDomains>_>
         .
         super__Vector_base<duckdb::FilterInfoWithTotalDomains,_std::allocator<duckdb::FilterInfoWithTotalDomains>_>
         ._M_impl.super__Vector_impl_data._M_start;
  do {
    sVar3 = unused_edge_tdoms._M_h._M_element_count;
    if (edge == (CardinalityEstimator *)
                edges.
                super_vector<duckdb::FilterInfoWithTotalDomains,_std::allocator<duckdb::FilterInfoWithTotalDomains>_>
                .
                super__Vector_base<duckdb::FilterInfoWithTotalDomains,_std::allocator<duckdb::FilterInfoWithTotalDomains>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
      this_02 = subgraphs.
                super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                .
                super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (1 < (ulong)(((long)subgraphs.
                             super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                             .
                             super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)subgraphs.
                            super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                            .
                            super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x18)) {
        pvVar6 = ::std::
                 vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                 ::at(&subgraphs.
                       super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                      ,0);
        subgraph_connections.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)pvVar6->denom;
        subgraph_connections.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)(pvVar6->relations).ptr;
        subgraph_connections.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)(pvVar6->numerator_relations).ptr;
        pSVar2 = subgraphs.
                 super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                 .
                 super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        while (this_02 = pSVar2 + 1,
              this_02 !=
              subgraphs.
              super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
              .
              super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
          pJVar7 = optional_ptr<duckdb::JoinRelationSet,_true>::operator*
                             ((optional_ptr<duckdb::JoinRelationSet,_true> *)&subgraph_connections);
          pJVar11 = optional_ptr<duckdb::JoinRelationSet,_true>::operator*(&this_02->relations);
          subgraph_connections.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)JoinRelationSetManager::Union(this_00,pJVar7,pJVar11);
          pJVar7 = optional_ptr<duckdb::JoinRelationSet,_true>::operator*
                             ((optional_ptr<duckdb::JoinRelationSet,_true> *)
                              &subgraph_connections.
                               super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_finish);
          pJVar11 = optional_ptr<duckdb::JoinRelationSet,_true>::operator*
                              (&pSVar2[1].numerator_relations);
          subgraph_connections.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               (pointer)JoinRelationSetManager::Union(this_00,pJVar7,pJVar11);
          subgraph_connections.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)(pSVar2[1].denom *
                        (double)subgraph_connections.
                                super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
          pSVar2 = this_02;
        }
      }
      local_c8 = 1.0;
      local_100 = set;
      if (subgraphs.
          super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>.
          super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
          ._M_impl.super__Vector_impl_data._M_start != this_02) {
        pvVar6 = ::std::
                 vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                 ::at(&subgraphs.
                       super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                      ,0);
        if ((pvVar6->denom != 0.0) || (NAN(pvVar6->denom))) {
          pvVar6 = ::std::
                   vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                   ::at(&subgraphs.
                         super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                        ,0);
          local_100 = optional_ptr<duckdb::JoinRelationSet,_true>::operator*
                                (&pvVar6->numerator_relations);
          pvVar6 = ::std::
                   vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                   ::at(&subgraphs.
                         super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                        ,0);
          local_f8 = (undefined4)sVar3;
          uStack_f4 = (undefined4)(sVar3 >> 0x20);
          local_c8 = (((double)CONCAT44(0x45300000,uStack_f4) - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,local_f8) - 4503599627370496.0) + 1.0) *
                     pvVar6->denom;
        }
      }
      __return_storage_ptr__->numerator_relations = local_100;
      __return_storage_ptr__->filter_strength = 1.0;
      __return_storage_ptr__->denominator = local_c8;
      ::std::
      _Vector_base<duckdb::FilterInfoWithTotalDomains,_std::allocator<duckdb::FilterInfoWithTotalDomains>_>
      ::~_Vector_base((_Vector_base<duckdb::FilterInfoWithTotalDomains,_std::allocator<duckdb::FilterInfoWithTotalDomains>_>
                       *)&edges);
      ::std::
      _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&unused_edge_tdoms._M_h);
      ::std::
      _Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>::
      ~_Vector_base((_Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                     *)&subgraphs);
      return __return_storage_ptr__;
    }
    if ((long)subgraphs.
              super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
              .
              super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)subgraphs.
              super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
              .
              super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
              ._M_impl.super__Vector_impl_data._M_start == 0x18) {
      pvVar6 = ::std::
               vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>::
               at(&subgraphs.
                   super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                  ,0);
      pJVar7 = optional_ptr<duckdb::JoinRelationSet,_true>::operator->(&pvVar6->relations);
      JoinRelationSet::ToString_abi_cxx11_((string *)&subgraph_connections,pJVar7);
      JoinRelationSet::ToString_abi_cxx11_((string *)&right_subgraph,set);
      _Var4 = ::std::operator==((string *)&subgraph_connections,(string *)&right_subgraph);
      ::std::__cxx11::string::~string((string *)&right_subgraph);
      ::std::__cxx11::string::~string((string *)&subgraph_connections);
      if (!_Var4) goto LAB_01a5e3b5;
      if (*(char *)&(edge->relation_set_2_cardinality)._M_h._M_buckets == '\x01') {
        ::std::__detail::
        _Insert_base<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::insert((_Insert_base<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  *)&unused_edge_tdoms,
                 (value_type *)
                 &(edge->relations_to_tdoms).
                  super_vector<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>.
                  super__Vector_base<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>
                  ._M_impl.super__Vector_impl_data._M_finish);
      }
    }
    else {
LAB_01a5e3b5:
      SubgraphsConnectedByEdge(&subgraph_connections,(FilterInfoWithTotalDomains *)edge,&subgraphs);
      if (subgraph_connections.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start ==
          subgraph_connections.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        right_subgraph.relations.ptr = (JoinRelationSet *)0x0;
        right_subgraph.numerator_relations.ptr = (JoinRelationSet *)0x0;
        right_subgraph.denom = 1.0;
        pFVar10 = optional_ptr<duckdb::FilterInfo,_true>::operator->
                            ((optional_ptr<duckdb::FilterInfo,_true> *)edge);
        right_subgraph.relations.ptr = (pFVar10->left_set).ptr;
        pFVar10 = optional_ptr<duckdb::FilterInfo,_true>::operator->
                            ((optional_ptr<duckdb::FilterInfo,_true> *)edge);
        right_subgraph.numerator_relations.ptr = (pFVar10->left_set).ptr;
        pFVar10 = optional_ptr<duckdb::FilterInfo,_true>::operator->
                            ((optional_ptr<duckdb::FilterInfo,_true> *)edge);
        pJVar7 = (pFVar10->right_set).ptr;
        pFVar10 = optional_ptr<duckdb::FilterInfo,_true>::operator->
                            ((optional_ptr<duckdb::FilterInfo,_true> *)edge);
        pJVar11 = (pFVar10->right_set).ptr;
        left.numerator_relations.ptr = right_subgraph.numerator_relations.ptr;
        left.relations.ptr = right_subgraph.relations.ptr;
        left.denom = right_subgraph.denom;
        right_01.numerator_relations.ptr = pJVar11;
        right_01.relations.ptr = pJVar7;
        right_01.denom = 1.0;
        right_subgraph.numerator_relations.ptr =
             UpdateNumeratorRelations(this,left,right_01,(FilterInfoWithTotalDomains *)edge);
        pCVar14 = edge;
        pFVar10 = optional_ptr<duckdb::FilterInfo,_true>::operator->
                            ((optional_ptr<duckdb::FilterInfo,_true> *)edge);
        right_subgraph.relations.ptr = (pFVar10->set)._M_data;
        left_00.numerator_relations.ptr = right_subgraph.numerator_relations.ptr;
        left_00.relations.ptr = right_subgraph.relations.ptr;
        left_00.denom = right_subgraph.denom;
        right_02.numerator_relations.ptr = pJVar11;
        right_02.relations.ptr = pJVar7;
        right_02.denom = 1.0;
        right_subgraph.denom =
             CalculateUpdatedDenom(pCVar14,left_00,right_02,(FilterInfoWithTotalDomains *)edge);
        ::std::vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>::
        push_back(&subgraphs.
                   super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                  ,&right_subgraph);
      }
      else {
        lVar8 = (long)subgraph_connections.
                      super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)subgraph_connections.
                      super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3;
        if (lVar8 == 2) {
          pvVar9 = ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                              &subgraph_connections,0);
          pvVar6 = ::std::
                   vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                   ::at(&subgraphs.
                         super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                        ,*pvVar9);
          pvVar9 = ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                              &subgraph_connections,1);
          this_01 = ::std::
                    vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                    ::at(&subgraphs.
                          super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                         ,*pvVar9);
          pJVar7 = optional_ptr<duckdb::JoinRelationSet,_true>::operator*(&pvVar6->relations);
          pJVar11 = optional_ptr<duckdb::JoinRelationSet,_true>::operator*(&this_01->relations);
          pJVar7 = JoinRelationSetManager::Union(this_00,pJVar7,pJVar11);
          (pvVar6->relations).ptr = pJVar7;
          right_03.relations.ptr = (this_01->relations).ptr;
          right_03.numerator_relations.ptr = (this_01->numerator_relations).ptr;
          right_03.denom = this_01->denom;
          left_03.relations.ptr = (pvVar6->relations).ptr;
          left_03.numerator_relations.ptr = (pvVar6->numerator_relations).ptr;
          left_03.denom = pvVar6->denom;
          pCVar14 = this;
          pJVar7 = UpdateNumeratorRelations
                             (this,left_03,right_03,(FilterInfoWithTotalDomains *)edge);
          (pvVar6->numerator_relations).ptr = pJVar7;
          right_04.relations.ptr = (this_01->relations).ptr;
          right_04.numerator_relations.ptr = (this_01->numerator_relations).ptr;
          right_04.denom = this_01->denom;
          left_04.relations.ptr = (pvVar6->relations).ptr;
          left_04.numerator_relations.ptr = (pvVar6->numerator_relations).ptr;
          left_04.denom = pvVar6->denom;
          dVar1 = CalculateUpdatedDenom(pCVar14,left_04,right_04,(FilterInfoWithTotalDomains *)edge)
          ;
          pvVar6->denom = dVar1;
          (this_01->relations).ptr = (JoinRelationSet *)0x0;
          lVar12 = (long)subgraphs.
                         super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                         .
                         super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)subgraphs.
                         super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                         .
                         super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                         ._M_impl.super__Vector_impl_data._M_start;
          pSVar13 = subgraphs.
                    super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                    .
                    super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          for (lVar8 = lVar12 / 0x18 >> 2; 0 < lVar8; lVar8 = lVar8 + -1) {
            if ((pSVar13->relations).ptr == (JoinRelationSet *)0x0) goto LAB_01a5e83f;
            if (pSVar13[1].relations.ptr == (JoinRelationSet *)0x0) {
              pSVar13 = pSVar13 + 1;
              goto LAB_01a5e83f;
            }
            if (pSVar13[2].relations.ptr == (JoinRelationSet *)0x0) {
              pSVar13 = pSVar13 + 2;
              goto LAB_01a5e83f;
            }
            if (pSVar13[3].relations.ptr == (JoinRelationSet *)0x0) {
              pSVar13 = pSVar13 + 3;
              goto LAB_01a5e83f;
            }
            pSVar13 = pSVar13 + 4;
            lVar12 = lVar12 + -0x60;
          }
          lVar12 = lVar12 / 0x18;
          if (lVar12 == 1) {
LAB_01a5e825:
            if ((pSVar13->relations).ptr != (JoinRelationSet *)0x0) {
              pSVar13 = subgraphs.
                        super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                        .
                        super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            }
LAB_01a5e83f:
            __first._M_current = pSVar13;
            pSVar15 = pSVar13;
            if (pSVar13 !=
                subgraphs.
                super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                .
                super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              while (pSVar16 = pSVar15, pSVar15 = pSVar16 + 1, __first._M_current = pSVar13,
                    pSVar15 !=
                    subgraphs.
                    super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                    .
                    super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
                if ((pSVar15->relations).ptr != (JoinRelationSet *)0x0) {
                  pSVar13->denom = pSVar16[1].denom;
                  pJVar7 = pSVar16[1].numerator_relations.ptr;
                  (pSVar13->relations).ptr = (pSVar15->relations).ptr;
                  (pSVar13->numerator_relations).ptr = pJVar7;
                  pSVar13 = pSVar13 + 1;
                }
              }
            }
          }
          else {
            if (lVar12 == 2) {
LAB_01a5e81b:
              if ((pSVar13->relations).ptr != (JoinRelationSet *)0x0) {
                pSVar13 = pSVar13 + 1;
                goto LAB_01a5e825;
              }
              goto LAB_01a5e83f;
            }
            __first._M_current =
                 subgraphs.
                 super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                 .
                 super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            if (lVar12 == 3) {
              if ((pSVar13->relations).ptr != (JoinRelationSet *)0x0) {
                pSVar13 = pSVar13 + 1;
                goto LAB_01a5e81b;
              }
              goto LAB_01a5e83f;
            }
          }
          ::std::vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
          ::erase(&subgraphs.
                   super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                  ,__first,(const_iterator)
                           subgraphs.
                           super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                           .
                           super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
        }
        else if (lVar8 == 1) {
          pvVar9 = ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                              &subgraph_connections,0);
          pvVar6 = ::std::
                   vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                   ::at(&subgraphs.
                         super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                        ,*pvVar9);
          right_subgraph.relations.ptr = (JoinRelationSet *)0x0;
          right_subgraph.numerator_relations.ptr = (JoinRelationSet *)0x0;
          right_subgraph.denom = 1.0;
          pFVar10 = optional_ptr<duckdb::FilterInfo,_true>::operator->
                              ((optional_ptr<duckdb::FilterInfo,_true> *)edge);
          right_subgraph.relations.ptr = (pFVar10->right_set).ptr;
          pFVar10 = optional_ptr<duckdb::FilterInfo,_true>::operator->
                              ((optional_ptr<duckdb::FilterInfo,_true> *)edge);
          right_subgraph.numerator_relations.ptr = (pFVar10->right_set).ptr;
          pJVar7 = optional_ptr<duckdb::JoinRelationSet,_true>::operator*(&pvVar6->relations);
          pJVar11 = optional_ptr<duckdb::JoinRelationSet,_true>::operator*
                              (&right_subgraph.relations);
          bVar5 = JoinRelationSet::IsSubset(pJVar7,pJVar11);
          if (bVar5) {
            pFVar10 = optional_ptr<duckdb::FilterInfo,_true>::operator->
                                ((optional_ptr<duckdb::FilterInfo,_true> *)edge);
            right_subgraph.relations.ptr = (pFVar10->left_set).ptr;
            pFVar10 = optional_ptr<duckdb::FilterInfo,_true>::operator->
                                ((optional_ptr<duckdb::FilterInfo,_true> *)edge);
            right_subgraph.numerator_relations.ptr = (pFVar10->left_set).ptr;
          }
          pJVar7 = optional_ptr<duckdb::JoinRelationSet,_true>::operator*(&pvVar6->relations);
          pFVar10 = optional_ptr<duckdb::FilterInfo,_true>::operator->
                              ((optional_ptr<duckdb::FilterInfo,_true> *)edge);
          pJVar11 = optional_ptr<duckdb::JoinRelationSet,_true>::operator*(&pFVar10->left_set);
          bVar5 = JoinRelationSet::IsSubset(pJVar7,pJVar11);
          if (bVar5) {
            pJVar7 = optional_ptr<duckdb::JoinRelationSet,_true>::operator*(&pvVar6->relations);
            pFVar10 = optional_ptr<duckdb::FilterInfo,_true>::operator->
                                ((optional_ptr<duckdb::FilterInfo,_true> *)edge);
            pJVar11 = optional_ptr<duckdb::JoinRelationSet,_true>::operator*(&pFVar10->right_set);
            bVar5 = JoinRelationSet::IsSubset(pJVar7,pJVar11);
            if (bVar5) goto LAB_01a5e883;
          }
          left_01.relations.ptr = (pvVar6->relations).ptr;
          left_01.numerator_relations.ptr = (pvVar6->numerator_relations).ptr;
          left_01.denom = pvVar6->denom;
          right.numerator_relations.ptr = right_subgraph.numerator_relations.ptr;
          right.relations.ptr = right_subgraph.relations.ptr;
          right.denom = right_subgraph.denom;
          pJVar7 = UpdateNumeratorRelations(this,left_01,right,(FilterInfoWithTotalDomains *)edge);
          (pvVar6->numerator_relations).ptr = pJVar7;
          pJVar7 = optional_ptr<duckdb::JoinRelationSet,_true>::operator*(&pvVar6->relations);
          pJVar11 = optional_ptr<duckdb::JoinRelationSet,_true>::operator*
                              (&right_subgraph.relations);
          pCVar14 = (CardinalityEstimator *)this_00;
          pJVar7 = JoinRelationSetManager::Union(this_00,pJVar7,pJVar11);
          (pvVar6->relations).ptr = pJVar7;
          left_02.relations.ptr = (pvVar6->relations).ptr;
          left_02.numerator_relations.ptr = (pvVar6->numerator_relations).ptr;
          left_02.denom = pvVar6->denom;
          right_00.numerator_relations.ptr = right_subgraph.numerator_relations.ptr;
          right_00.relations.ptr = right_subgraph.relations.ptr;
          right_00.denom = right_subgraph.denom;
          dVar1 = CalculateUpdatedDenom(pCVar14,left_02,right_00,(FilterInfoWithTotalDomains *)edge)
          ;
          pvVar6->denom = dVar1;
        }
      }
LAB_01a5e883:
      ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
                 &subgraph_connections);
    }
    edge = (CardinalityEstimator *)&(edge->relation_set_2_cardinality)._M_h._M_bucket_count;
  } while( true );
}

Assistant:

DenomInfo CardinalityEstimator::GetDenominator(JoinRelationSet &set) {
	vector<Subgraph2Denominator> subgraphs;

	// Finding the denominator is tricky. You need to go through the tdoms in decreasing order
	// Then loop through all filters in the equivalence set of the tdom to see if both the
	// left and right relations are in the new set, if so you can use that filter.
	// You must also make sure that the filters all relations in the given set, so we use subgraphs
	// that should eventually merge into one connected graph that joins all the relations
	// TODO: Implement a method to cache subgraphs so you don't have to build them up every
	// time the cardinality of a new set is requested

	// relations_to_tdoms has already been sorted by largest to smallest total domain
	// then we look through the filters for the relations_to_tdoms,
	// and we start to choose the filters that join relations in the set.

	// edges are guaranteed to be in order of largest tdom to smallest tdom.
	unordered_set<idx_t> unused_edge_tdoms;
	auto edges = GetEdges(relations_to_tdoms, set);
	for (auto &edge : edges) {
		if (subgraphs.size() == 1 && subgraphs.at(0).relations->ToString() == set.ToString()) {
			// the first subgraph has connected all the desired relations, just skip the rest of the edges
			if (edge.has_tdom_hll) {
				unused_edge_tdoms.insert(edge.tdom_hll);
			}
			continue;
		}

		auto subgraph_connections = SubgraphsConnectedByEdge(edge, subgraphs);
		if (subgraph_connections.empty()) {
			// create a subgraph out of left and right, then merge right into left and add left to subgraphs.
			// this helps cover a case where there are no subgraphs yet, and the only join filter is a SEMI JOIN
			auto left_subgraph = Subgraph2Denominator();
			auto right_subgraph = Subgraph2Denominator();
			left_subgraph.relations = edge.filter_info->left_set;
			left_subgraph.numerator_relations = edge.filter_info->left_set;
			right_subgraph.relations = edge.filter_info->right_set;
			right_subgraph.numerator_relations = edge.filter_info->right_set;
			left_subgraph.numerator_relations = &UpdateNumeratorRelations(left_subgraph, right_subgraph, edge);
			left_subgraph.relations = edge.filter_info->set.get();
			left_subgraph.denom = CalculateUpdatedDenom(left_subgraph, right_subgraph, edge);
			subgraphs.push_back(left_subgraph);
		} else if (subgraph_connections.size() == 1) {
			auto left_subgraph = &subgraphs.at(subgraph_connections.at(0));
			auto right_subgraph = Subgraph2Denominator();
			right_subgraph.relations = edge.filter_info->right_set;
			right_subgraph.numerator_relations = edge.filter_info->right_set;
			if (JoinRelationSet::IsSubset(*left_subgraph->relations, *right_subgraph.relations)) {
				right_subgraph.relations = edge.filter_info->left_set;
				right_subgraph.numerator_relations = edge.filter_info->left_set;
			}

			if (JoinRelationSet::IsSubset(*left_subgraph->relations, *edge.filter_info->left_set) &&
			    JoinRelationSet::IsSubset(*left_subgraph->relations, *edge.filter_info->right_set)) {
				// here we have an edge that connects the same subgraph to the same subgraph. Just continue. no need to
				// update the denom
				continue;
			}
			left_subgraph->numerator_relations = &UpdateNumeratorRelations(*left_subgraph, right_subgraph, edge);
			left_subgraph->relations = &set_manager.Union(*left_subgraph->relations, *right_subgraph.relations);
			left_subgraph->denom = CalculateUpdatedDenom(*left_subgraph, right_subgraph, edge);
		} else if (subgraph_connections.size() == 2) {
			// The two subgraphs in the subgraph_connections can be merged by this edge.
			D_ASSERT(subgraph_connections.at(0) < subgraph_connections.at(1));
			auto subgraph_to_merge_into = &subgraphs.at(subgraph_connections.at(0));
			auto subgraph_to_delete = &subgraphs.at(subgraph_connections.at(1));
			subgraph_to_merge_into->relations =
			    &set_manager.Union(*subgraph_to_merge_into->relations, *subgraph_to_delete->relations);
			subgraph_to_merge_into->numerator_relations =
			    &UpdateNumeratorRelations(*subgraph_to_merge_into, *subgraph_to_delete, edge);
			subgraph_to_merge_into->denom = CalculateUpdatedDenom(*subgraph_to_merge_into, *subgraph_to_delete, edge);
			subgraph_to_delete->relations = nullptr;
			auto remove_start = std::remove_if(subgraphs.begin(), subgraphs.end(),
			                                   [](Subgraph2Denominator &s) { return !s.relations; });
			subgraphs.erase(remove_start, subgraphs.end());
		}
	}

	// Slight penalty to cardinality for unused edges
	auto denom_multiplier = 1.0 + static_cast<double>(unused_edge_tdoms.size());

	// It's possible cross-products were added and are not present in the filters in the relation_2_tdom
	// structures. When that's the case, merge all remaining subgraphs.
	if (subgraphs.size() > 1) {
		auto final_subgraph = subgraphs.at(0);
		for (auto merge_with = subgraphs.begin() + 1; merge_with != subgraphs.end(); merge_with++) {
			D_ASSERT(final_subgraph.relations && merge_with->relations);
			final_subgraph.relations = &set_manager.Union(*final_subgraph.relations, *merge_with->relations);
			D_ASSERT(final_subgraph.numerator_relations && merge_with->numerator_relations);
			final_subgraph.numerator_relations =
			    &set_manager.Union(*final_subgraph.numerator_relations, *merge_with->numerator_relations);
			final_subgraph.denom *= merge_with->denom;
		}
	}
	// can happen if a table has cardinality 0, a tdom is set to 0, or if a cross product is used.
	if (subgraphs.empty() || subgraphs.at(0).denom == 0) {
		// denominator is 1 and numerators are a cross product of cardinalities.
		return DenomInfo(set, 1, 1);
	}
	return DenomInfo(*subgraphs.at(0).numerator_relations, 1, subgraphs.at(0).denom * denom_multiplier);
}